

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O2

void __thiscall
utObjImportExport_homogeneous_coordinates_Test_Test::TestBody
          (utObjImportExport_homogeneous_coordinates_Test_Test *this)

{
  aiMesh *paVar1;
  aiVector3D *paVar2;
  char *pcVar3;
  AssertionResult gtest_ar_4;
  AssertHelper local_50;
  aiVector3D vertice;
  AssertHelper local_38;
  aiFace face;
  aiScene *scene;
  Importer myimporter;
  
  Assimp::Importer::Importer(&myimporter);
  pcVar3 = "";
  scene = Assimp::Importer::ReadFileFromMemory
                    (&myimporter,
                     "v -0.500000 0.000000 0.400000 0.50000\nv -0.500000 0.000000 -0.800000 1.00000\nv 0.500000 1.000000 -0.800000 0.5000\nf 1 2 3\nB"
                     ,0x7b,0x400,"");
  gtest_ar_4.success_ = false;
  gtest_ar_4._1_7_ = 0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)&face,"nullptr","scene",(void **)&gtest_ar_4,&scene);
  if ((char)face.mNumIndices == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (face.mIndices != (uint *)0x0) {
      pcVar3 = *(char **)face.mIndices;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vertice,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x156,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&vertice,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vertice);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&face.mIndices);
  gtest_ar_4._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&face,"scene->mNumMeshes","1U",&scene->mNumMeshes,(uint *)&gtest_ar_4);
  if ((char)face.mNumIndices == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (face.mIndices == (uint *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)face.mIndices;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vertice,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x158,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&vertice,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vertice);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&face.mIndices);
  paVar1 = *scene->mMeshes;
  gtest_ar_4._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&face,"mesh->mNumVertices","3U",&paVar1->mNumVertices,(uint *)&gtest_ar_4);
  if ((char)face.mNumIndices == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (face.mIndices == (uint *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)face.mIndices;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vertice,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x15a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&vertice,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vertice);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&face.mIndices);
  gtest_ar_4._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&face,"mesh->mNumFaces","1U",&paVar1->mNumFaces,(uint *)&gtest_ar_4);
  if ((char)face.mNumIndices == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (face.mIndices == (uint *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)face.mIndices;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vertice,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x15b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&vertice,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vertice);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&face.mIndices);
  aiFace::aiFace(&face,paVar1->mFaces);
  vertice.x = 4.2039e-45;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_4,"face.mNumIndices","3U",&face.mNumIndices,(uint *)&vertice);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&vertice);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x15d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&vertice);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertice);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  paVar2 = paVar1->mVertices;
  vertice.z = paVar2->z;
  vertice.x = paVar2->x;
  vertice.y = paVar2->y;
  local_50.data_._0_4_ = 0xbf800000;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&gtest_ar_4,"vertice.x","-1.0f",&vertice.x,(float *)&local_50);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x15f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  local_50.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&gtest_ar_4,"vertice.y","0.0f",&vertice.y,(float *)&local_50);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x160,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  local_50.data_._0_4_ = 0x3f4ccccd;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&gtest_ar_4,"vertice.z","0.8f",&vertice.z,(float *)&local_50);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x161,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  aiFace::~aiFace(&face);
  Assimp::Importer::~Importer(&myimporter);
  return;
}

Assistant:

TEST_F(utObjImportExport, homogeneous_coordinates_Test) {
    static const char *ObjModel =
        "v -0.500000 0.000000 0.400000 0.50000\n"
        "v -0.500000 0.000000 -0.800000 1.00000\n"
        "v 0.500000 1.000000 -0.800000 0.5000\n"
        "f 1 2 3\nB";

    Assimp::Importer myimporter;
    const aiScene *scene = myimporter.ReadFileFromMemory(ObjModel, strlen(ObjModel), aiProcess_ValidateDataStructure);
    EXPECT_NE(nullptr, scene);

    EXPECT_EQ(scene->mNumMeshes, 1U);
    const aiMesh *mesh = scene->mMeshes[0];
    EXPECT_EQ(mesh->mNumVertices, 3U);
    EXPECT_EQ(mesh->mNumFaces, 1U);
    const aiFace face = mesh->mFaces[0];
    EXPECT_EQ(face.mNumIndices, 3U);
    const aiVector3D vertice = mesh->mVertices[0];
    EXPECT_EQ(vertice.x, -1.0f);
    EXPECT_EQ(vertice.y, 0.0f);
    EXPECT_EQ(vertice.z, 0.8f);
}